

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

QJsonValue * __thiscall
QJsonValueConstRef::concrete
          (QJsonValue *__return_storage_ptr__,QJsonValueConstRef *this,QJsonValueConstRef self)

{
  long in_FS_OFFSET;
  QCborValue QStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QCborContainerPrivate::valueAt
            (&QStack_28,(QCborContainerPrivate *)(this->field_0).a,
             (ulong)self.field_0.a >> (~self.field_0._0_1_ & 1));
  QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,&QStack_28);
  QCborValue::~QCborValue((QCborValue *)&QStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonValueConstRef::concrete(QJsonValueConstRef self) noexcept
{
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);
    return QJsonPrivate::Value::fromTrustedCbor(d->valueAt(index));
}